

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_kv_functional_test.cc
# Opt level: O2

void multi_kv_rollback_test(uint8_t opt,size_t chunksize)

{
  void *pvVar1;
  fdb_doc *pfVar2;
  ushort uVar3;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  char *__format;
  undefined7 in_register_00000039;
  ulong uVar10;
  fdb_doc *doc;
  char local_3d2;
  char local_3d1;
  fdb_kvs_handle *kv2;
  fdb_kvs_handle *kv1;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  uint local_3ac;
  fdb_seqnum_t seq3;
  fdb_seqnum_t seq2;
  fdb_seqnum_t seq1;
  fdb_kvs_config local_390;
  fdb_custom_cmp_variable functions [3];
  char *kvs_names [3];
  char value [256];
  timeval __test_begin;
  char key [256];
  fdb_config local_128;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  kvs_names[2] = "kv2";
  kvs_names[0] = (char *)0x0;
  kvs_names[1] = "kv1";
  functions[2] = _multi_kv_test_keycmp;
  functions[0] = _multi_kv_test_keycmp;
  functions[1] = _multi_kv_test_keycmp;
  builtin_strncpy(value,"rm -rf  multi_kv_test*",0x17);
  system(value);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  local_128.seqtree_opt = '\x01';
  local_128.chunksize = (uint16_t)chunksize;
  local_128.multi_kv_instances = true;
  local_128.wal_threshold = 1000;
  local_128.buffercache_size = 0;
  local_128.block_reusing_threshold = 0;
  local_3ac = (uint)CONCAT71(in_register_00000039,opt);
  if ((opt & 1) == 0) {
    fVar4 = fdb_open(&dbfile,"./multi_kv_test",&local_128);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x5ff);
      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x5ff,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  else {
    fVar4 = fdb_open_custom_cmp(&dbfile,"./multi_kv_test",&local_128,3,kvs_names,functions,
                                (void **)0x0);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x5fc);
      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x5fc,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
  }
  fVar4 = fdb_kvs_open(dbfile,&db,(char *)0x0,&local_390);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x602);
    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x602,"void multi_kv_rollback_test(uint8_t, size_t)");
  }
  fVar4 = fdb_kvs_open(dbfile,&kv1,"kv1",&local_390);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x604);
    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x604,"void multi_kv_rollback_test(uint8_t, size_t)");
  }
  fVar4 = fdb_kvs_open(dbfile,&kv2,"kv2",&local_390);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
            ,0x606);
    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x606,"void multi_kv_rollback_test(uint8_t, size_t)");
  }
  uVar10 = 0;
  while( true ) {
    uVar3 = (ushort)uVar10 & 0xff;
    if ((int)uVar10 == 100) {
      fVar4 = fdb_commit(dbfile,'\x01');
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x620);
        multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x620,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
      fVar4 = fdb_get_kvs_seqnum(kv1,&seq1);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x622);
        multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x622,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
      uVar10 = 0;
      while( true ) {
        uVar3 = (ushort)uVar10 & 0xff;
        if ((int)uVar10 == 100) {
          fVar4 = fdb_commit(dbfile,'\x01');
          if (fVar4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x63c);
            multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x63c,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
          fVar4 = fdb_get_kvs_seqnum(db,&seq2);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x63e);
            multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x63e,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
          uVar10 = 0;
          while( true ) {
            uVar3 = (ushort)uVar10 & 0xff;
            if ((int)uVar10 == 100) {
              fVar4 = fdb_commit(dbfile,'\0');
              if (fVar4 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x658);
                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x658,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
              fVar4 = fdb_get_kvs_seqnum(kv2,&seq3);
              if (fVar4 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x65a);
                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x65a,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
              uVar10 = 0;
              while( true ) {
                uVar3 = (ushort)uVar10 & 0xff;
                if ((int)uVar10 == 100) {
                  fVar4 = fdb_commit(dbfile,'\0');
                  if (fVar4 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x674);
                    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x674,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                  fVar4 = fdb_rollback(&kv1,seq1);
                  if (fVar4 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x678);
                    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x678,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                  uVar9 = 0;
                  while( true ) {
                    if (uVar9 == 100) {
                      fVar4 = fdb_rollback(&db,seq2);
                      if (fVar4 != FDB_RESULT_SUCCESS) {
                        fprintf(_stderr,"Test failed: %s %d\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x693);
                        multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                        __assert_fail("s == FDB_RESULT_SUCCESS",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x693,"void multi_kv_rollback_test(uint8_t, size_t)");
                      }
                      uVar9 = 0;
                      while( true ) {
                        if (uVar9 == 100) {
                          fVar4 = fdb_rollback(&kv2,seq3);
                          if (fVar4 != FDB_RESULT_SUCCESS) {
                            fprintf(_stderr,"Test failed: %s %d\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x6ae);
                            multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                            __assert_fail("s == FDB_RESULT_SUCCESS",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6ae,"void multi_kv_rollback_test(uint8_t, size_t)");
                          }
                          uVar9 = 0;
                          while( true ) {
                            if (uVar9 == 100) {
                              fVar4 = fdb_kvs_close(kv1);
                              if (fVar4 != FDB_RESULT_SUCCESS) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6c9);
                                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1
                                ;
                                __assert_fail("s == FDB_RESULT_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                              ,0x6c9,"void multi_kv_rollback_test(uint8_t, size_t)")
                                ;
                              }
                              fVar4 = fdb_kvs_close(kv2);
                              if (fVar4 != FDB_RESULT_SUCCESS) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6cb);
                                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1
                                ;
                                __assert_fail("s == FDB_RESULT_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                              ,0x6cb,"void multi_kv_rollback_test(uint8_t, size_t)")
                                ;
                              }
                              fVar4 = fdb_close(dbfile);
                              if (fVar4 != FDB_RESULT_SUCCESS) {
                                fprintf(_stderr,"Test failed: %s %d\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6cd);
                                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1
                                ;
                                __assert_fail("s == FDB_RESULT_SUCCESS",
                                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                              ,0x6cd,"void multi_kv_rollback_test(uint8_t, size_t)")
                                ;
                              }
                              if ((local_3ac & 1) == 0) {
                                fVar4 = fdb_open(&dbfile,"./multi_kv_test",&local_128);
                                if (fVar4 != FDB_RESULT_SUCCESS) {
                                  fprintf(_stderr,"Test failed: %s %d\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6d5);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6d5,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                              }
                              else {
                                fVar4 = fdb_open_custom_cmp(&dbfile,"./multi_kv_test",&local_128,3,
                                                            kvs_names,functions,(void **)0x0);
                                if (fVar4 != FDB_RESULT_SUCCESS) {
                                  fprintf(_stderr,"Test failed: %s %d\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6d2);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6d2,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                              }
                              fdb_kvs_open(dbfile,&db,(char *)0x0,&local_390);
                              fdb_kvs_open(dbfile,&kv1,"kv1",&local_390);
                              fdb_kvs_open(dbfile,&kv2,"kv2",&local_390);
                              uVar9 = 0;
                              while( true ) {
                                if (uVar9 == 100) {
                                  fdb_kvs_close(kv1);
                                  fdb_kvs_close(kv2);
                                  fdb_close(dbfile);
                                  fdb_shutdown();
                                  memleak_end();
                                  if ((local_3ac & 1) == 0) {
                                    if ((multi_kv_rollback_test(unsigned_char,unsigned_long)::
                                         __test_pass & 1) == 0) {
                                      __format = "%s PASSED\n";
                                    }
                                    else {
                                      __format = "%s FAILED\n";
                                    }
                                    pcVar8 = "multiple KV instances rollback test";
                                  }
                                  else {
                                    if ((multi_kv_rollback_test(unsigned_char,unsigned_long)::
                                         __test_pass & 1) == 0) {
                                      __format = "%s PASSED\n";
                                    }
                                    else {
                                      __format = "%s FAILED\n";
                                    }
                                    pcVar8 = 
                                    "multiple KV instances rollback test (custom key order)";
                                  }
                                  fprintf(_stderr,__format,pcVar8);
                                  return;
                                }
                                sprintf(key,"key%06d",(ulong)uVar9);
                                sprintf(value,"value%08d(%s)",(ulong)uVar9);
                                sVar6 = strlen(key);
                                fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                                fVar4 = fdb_get(db,doc);
                                pfVar2 = doc;
                                if (fVar4 != FDB_RESULT_SUCCESS) {
                                  fprintf(_stderr,"Test failed: %s %d\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6e2);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6e2,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                                pvVar1 = doc->body;
                                iVar5 = bcmp(value,pvVar1,doc->bodylen);
                                if (iVar5 != 0) {
                                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                                          pvVar1,value,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6e3);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6e3,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                                fdb_doc_free(pfVar2);
                                sprintf(value,"value%08d(%s)",(ulong)uVar9);
                                sVar6 = strlen(key);
                                fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                                fVar4 = fdb_get(kv1,doc);
                                pfVar2 = doc;
                                if (fVar4 != FDB_RESULT_SUCCESS) break;
                                pvVar1 = doc->body;
                                iVar5 = bcmp(value,pvVar1,doc->bodylen);
                                if (iVar5 != 0) {
                                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                                          pvVar1,value,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6e9);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6e9,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                                fdb_doc_free(pfVar2);
                                sprintf(value,"value%08d(%s)",(ulong)uVar9);
                                sVar6 = strlen(key);
                                fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                                fVar4 = fdb_get(kv2,doc);
                                pfVar2 = doc;
                                if (fVar4 != FDB_RESULT_SUCCESS) {
                                  fprintf(_stderr,"Test failed: %s %d\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6ee);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6ee,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                                pvVar1 = doc->body;
                                iVar5 = bcmp(value,pvVar1,doc->bodylen);
                                if (iVar5 != 0) {
                                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                                          pvVar1,value,
                                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                          ,0x6ef);
                                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass =
                                       1;
                                  __assert_fail("false",
                                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                                ,0x6ef,
                                                "void multi_kv_rollback_test(uint8_t, size_t)");
                                }
                                fdb_doc_free(pfVar2);
                                uVar9 = uVar9 + 1;
                              }
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x6e8);
                              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                              __assert_fail("s == FDB_RESULT_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                            ,0x6e8,"void multi_kv_rollback_test(uint8_t, size_t)");
                            }
                            sprintf(key,"key%06d",(ulong)uVar9);
                            sprintf(value,"value%08d(%s)",(ulong)uVar9);
                            sVar6 = strlen(key);
                            fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                            fVar4 = fdb_get(db,doc);
                            pfVar2 = doc;
                            if (fVar4 != FDB_RESULT_SUCCESS) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x6b6);
                              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                              __assert_fail("s == FDB_RESULT_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                            ,0x6b6,"void multi_kv_rollback_test(uint8_t, size_t)");
                            }
                            pvVar1 = doc->body;
                            iVar5 = bcmp(value,pvVar1,doc->bodylen);
                            if (iVar5 != 0) {
                              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,
                                      value,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x6b7);
                              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                              __assert_fail("false",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                            ,0x6b7,"void multi_kv_rollback_test(uint8_t, size_t)");
                            }
                            fdb_doc_free(pfVar2);
                            sprintf(value,"value%08d(%s)",(ulong)uVar9);
                            sVar6 = strlen(key);
                            fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                            fVar4 = fdb_get(kv1,doc);
                            pfVar2 = doc;
                            if (fVar4 != FDB_RESULT_SUCCESS) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x6bc);
                              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                              __assert_fail("s == FDB_RESULT_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                            ,0x6bc,"void multi_kv_rollback_test(uint8_t, size_t)");
                            }
                            pvVar1 = doc->body;
                            iVar5 = bcmp(value,pvVar1,doc->bodylen);
                            if (iVar5 != 0) {
                              fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,
                                      value,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x6bd);
                              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                              __assert_fail("false",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                            ,0x6bd,"void multi_kv_rollback_test(uint8_t, size_t)");
                            }
                            fdb_doc_free(pfVar2);
                            sprintf(value,"value%08d(%s)",(ulong)uVar9);
                            sVar6 = strlen(key);
                            fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                            fVar4 = fdb_get(kv2,doc);
                            pfVar2 = doc;
                            if (fVar4 != FDB_RESULT_SUCCESS) {
                              fprintf(_stderr,"Test failed: %s %d\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                      ,0x6c2);
                              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                              __assert_fail("s == FDB_RESULT_SUCCESS",
                                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                            ,0x6c2,"void multi_kv_rollback_test(uint8_t, size_t)");
                            }
                            pvVar1 = doc->body;
                            iVar5 = bcmp(value,pvVar1,doc->bodylen);
                            if (iVar5 != 0) break;
                            fdb_doc_free(pfVar2);
                            uVar9 = uVar9 + 1;
                          }
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6c3);
                          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6c3,"void multi_kv_rollback_test(uint8_t, size_t)");
                        }
                        sprintf(key,"key%06d",(ulong)uVar9);
                        sprintf(value,"value%08d(%s)",(ulong)uVar9);
                        sVar6 = strlen(key);
                        fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                        fVar4 = fdb_get(db,doc);
                        pfVar2 = doc;
                        if (fVar4 != FDB_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x69b);
                          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x69b,"void multi_kv_rollback_test(uint8_t, size_t)");
                        }
                        pvVar1 = doc->body;
                        iVar5 = bcmp(value,pvVar1,doc->bodylen);
                        if (iVar5 != 0) {
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x69c);
                          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x69c,"void multi_kv_rollback_test(uint8_t, size_t)");
                        }
                        fdb_doc_free(pfVar2);
                        sprintf(value,"value%08d(%s)",(ulong)uVar9);
                        sVar6 = strlen(key);
                        fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                        fVar4 = fdb_get(kv1,doc);
                        pfVar2 = doc;
                        if (fVar4 != FDB_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6a1);
                          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6a1,"void multi_kv_rollback_test(uint8_t, size_t)");
                        }
                        pvVar1 = doc->body;
                        iVar5 = bcmp(value,pvVar1,doc->bodylen);
                        if (iVar5 != 0) break;
                        fdb_doc_free(pfVar2);
                        sprintf(value,"value%08d(%s)",(ulong)uVar9);
                        sVar6 = strlen(key);
                        fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                        fVar4 = fdb_get(kv2,doc);
                        pfVar2 = doc;
                        if (fVar4 != FDB_RESULT_SUCCESS) {
                          fprintf(_stderr,"Test failed: %s %d\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6a7);
                          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                          __assert_fail("s == FDB_RESULT_SUCCESS",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6a7,"void multi_kv_rollback_test(uint8_t, size_t)");
                        }
                        pvVar1 = doc->body;
                        iVar5 = bcmp(value,pvVar1,doc->bodylen);
                        if (iVar5 != 0) {
                          fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x6a8);
                          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                          __assert_fail("false",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                        ,0x6a8,"void multi_kv_rollback_test(uint8_t, size_t)");
                        }
                        fdb_doc_free(pfVar2);
                        uVar9 = uVar9 + 1;
                      }
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x6a2);
                      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x6a2,"void multi_kv_rollback_test(uint8_t, size_t)");
                    }
                    sprintf(key,"key%06d",(ulong)uVar9);
                    sprintf(value,"value%08d(%s)",(ulong)uVar9);
                    sVar6 = strlen(key);
                    fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                    fVar4 = fdb_get(db,doc);
                    pfVar2 = doc;
                    if (fVar4 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x680);
                      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x680,"void multi_kv_rollback_test(uint8_t, size_t)");
                    }
                    pvVar1 = doc->body;
                    iVar5 = bcmp(value,pvVar1,doc->bodylen);
                    if (iVar5 != 0) {
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x681);
                      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x681,"void multi_kv_rollback_test(uint8_t, size_t)");
                    }
                    fdb_doc_free(pfVar2);
                    sprintf(value,"value%08d(%s)",(ulong)uVar9);
                    sVar6 = strlen(key);
                    fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                    fVar4 = fdb_get(kv1,doc);
                    pfVar2 = doc;
                    if (fVar4 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x686);
                      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x686,"void multi_kv_rollback_test(uint8_t, size_t)");
                    }
                    pvVar1 = doc->body;
                    iVar5 = bcmp(value,pvVar1,doc->bodylen);
                    if (iVar5 != 0) break;
                    fdb_doc_free(pfVar2);
                    sprintf(value,"value%08d(%s)",(ulong)uVar9);
                    sVar6 = strlen(key);
                    fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,(void *)0x0,0);
                    fVar4 = fdb_get(kv2,doc);
                    pfVar2 = doc;
                    if (fVar4 != FDB_RESULT_SUCCESS) {
                      fprintf(_stderr,"Test failed: %s %d\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x68c);
                      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                      __assert_fail("s == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x68c,"void multi_kv_rollback_test(uint8_t, size_t)");
                    }
                    pvVar1 = doc->body;
                    iVar5 = bcmp(value,pvVar1,doc->bodylen);
                    if (iVar5 != 0) {
                      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x68d);
                      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                      __assert_fail("false",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                    ,0x68d,"void multi_kv_rollback_test(uint8_t, size_t)");
                    }
                    fdb_doc_free(pfVar2);
                    uVar9 = uVar9 + 1;
                  }
                  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar1,value,
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x687);
                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x687,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
                local_3d2 = (char)(uVar3 / 0x1b);
                local_3d1 = (char)(uVar3 / 0xf);
                sprintf(key,"key%06d",uVar10);
                sprintf(value,"value%08d(%s)",uVar10);
                sVar6 = strlen(key);
                sVar7 = strlen(value);
                fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
                fVar4 = fdb_set(db,doc);
                if (fVar4 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x662);
                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x662,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
                fdb_doc_free(doc);
                sprintf(value,"value%08d(%s)",uVar10);
                sVar6 = strlen(key);
                sVar7 = strlen(value);
                fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
                fVar4 = fdb_set(kv1,doc);
                if (fVar4 != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x667);
                  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                  __assert_fail("s == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                ,0x667,"void multi_kv_rollback_test(uint8_t, size_t)");
                }
                if ((char)(local_3d1 * -0xf + (char)uVar10) == '\0') {
                  fVar4 = fdb_set(kv1,doc);
                  if (fVar4 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x669);
                    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x669,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
                fdb_doc_free(doc);
                sprintf(value,"value%08d(%s)",uVar10);
                sVar6 = strlen(key);
                sVar7 = strlen(value);
                fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
                fVar4 = fdb_set(kv2,doc);
                if (fVar4 != FDB_RESULT_SUCCESS) break;
                if ((char)(local_3d2 * -0x1b + (char)uVar10) == '\0') {
                  fVar4 = fdb_set(kv2,doc);
                  if (fVar4 != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x670);
                    multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                    __assert_fail("s == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                                  ,0x670,"void multi_kv_rollback_test(uint8_t, size_t)");
                  }
                }
                fdb_doc_free(doc);
                uVar10 = (ulong)((int)uVar10 + 1);
              }
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x66e);
              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x66e,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
            local_3d2 = (char)(uVar3 / 0x1b);
            local_3d1 = (char)(uVar3 / 0xf);
            sprintf(key,"key%06d",uVar10);
            sprintf(value,"value%08d(%s)",uVar10);
            sVar6 = strlen(key);
            sVar7 = strlen(value);
            fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
            fVar4 = fdb_set(db,doc);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x646);
              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x646,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
            fdb_doc_free(doc);
            sprintf(value,"value%08d(%s)",uVar10);
            sVar6 = strlen(key);
            sVar7 = strlen(value);
            fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
            fVar4 = fdb_set(kv1,doc);
            if (fVar4 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x64b);
              multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
              __assert_fail("s == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                            ,0x64b,"void multi_kv_rollback_test(uint8_t, size_t)");
            }
            if ((char)(local_3d1 * -0xf + (char)uVar10) == '\0') {
              fVar4 = fdb_set(kv1,doc);
              if (fVar4 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x64d);
                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x64d,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
            }
            fdb_doc_free(doc);
            sprintf(value,"value%08d(%s)",uVar10);
            sVar6 = strlen(key);
            sVar7 = strlen(value);
            fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
            fVar4 = fdb_set(kv2,doc);
            if (fVar4 != FDB_RESULT_SUCCESS) break;
            if ((char)(local_3d2 * -0x1b + (char)uVar10) == '\0') {
              fVar4 = fdb_set(kv2,doc);
              if (fVar4 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x654);
                multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
                __assert_fail("s == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                              ,0x654,"void multi_kv_rollback_test(uint8_t, size_t)");
              }
            }
            fdb_doc_free(doc);
            uVar10 = (ulong)((int)uVar10 + 1);
          }
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x652);
          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x652,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
        local_3d2 = (char)(uVar3 / 0x1b);
        local_3d1 = (char)(uVar3 / 0xf);
        sprintf(key,"key%06d",uVar10);
        sprintf(value,"value%08d(%s)",uVar10);
        sVar6 = strlen(key);
        sVar7 = strlen(value);
        fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
        fVar4 = fdb_set(db,doc);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x62a);
          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x62a,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
        fdb_doc_free(doc);
        sprintf(value,"value%08d(%s)",uVar10);
        sVar6 = strlen(key);
        sVar7 = strlen(value);
        fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
        fVar4 = fdb_set(kv1,doc);
        if (fVar4 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                  ,0x62f);
          multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                        ,0x62f,"void multi_kv_rollback_test(uint8_t, size_t)");
        }
        if ((char)(local_3d1 * -0xf + (char)uVar10) == '\0') {
          fVar4 = fdb_set(kv1,doc);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x631);
            multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x631,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
        }
        fdb_doc_free(doc);
        sprintf(value,"value%08d(%s)",uVar10);
        sVar6 = strlen(key);
        sVar7 = strlen(value);
        fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
        fVar4 = fdb_set(kv2,doc);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        if ((char)(local_3d2 * -0x1b + (char)uVar10) == '\0') {
          fVar4 = fdb_set(kv2,doc);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x638);
            multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                          ,0x638,"void multi_kv_rollback_test(uint8_t, size_t)");
          }
        }
        fdb_doc_free(doc);
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x636);
      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x636,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
    local_3d2 = (char)(uVar3 / 0x1b);
    local_3d1 = (char)(uVar3 / 0xf);
    sprintf(key,"key%06d",uVar10);
    sprintf(value,"value%08d(%s)",uVar10);
    sVar6 = strlen(key);
    sVar7 = strlen(value);
    fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
    fVar4 = fdb_set(db,doc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x60e);
      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x60e,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
    fdb_doc_free(doc);
    sprintf(value,"value%08d(%s)",uVar10);
    sVar6 = strlen(key);
    sVar7 = strlen(value);
    fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
    fVar4 = fdb_set(kv1,doc);
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
              ,0x613);
      multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                    ,0x613,"void multi_kv_rollback_test(uint8_t, size_t)");
    }
    if ((char)(local_3d1 * -0xf + (char)uVar10) == '\0') {
      fVar4 = fdb_set(kv1,doc);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x615);
        multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x615,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free(doc);
    sprintf(value,"value%08d(%s)",uVar10);
    sVar6 = strlen(key);
    sVar7 = strlen(value);
    fdb_doc_create(&doc,key,sVar6 + 1,(void *)0x0,0,value,sVar7 + 1);
    fVar4 = fdb_set(kv2,doc);
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    if ((char)(local_3d2 * -0x1b + (char)uVar10) == '\0') {
      fVar4 = fdb_set(kv2,doc);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x61c);
        multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                      ,0x61c,"void multi_kv_rollback_test(uint8_t, size_t)");
      }
    }
    fdb_doc_free(doc);
    uVar10 = (ulong)((int)uVar10 + 1);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
          ,0x61a);
  multi_kv_rollback_test(unsigned_char,unsigned_long)::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/multi_kv_functional_test.cc"
                ,0x61a,"void multi_kv_rollback_test(uint8_t, size_t)");
}

Assistant:

void multi_kv_rollback_test(uint8_t opt, size_t chunksize)
{
    TEST_INIT();

    int n = 100;
    int i, r;
    char key[256], value[256];
    char keystr[] = "key%06d";
    char valuestr[] = "value%08d(%s)";
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1, *kv2;
    fdb_seqnum_t seq1, seq2, seq3;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s;

    char *kvs_names[] = {NULL, (char*)"kv1", (char*)"kv2"};
    fdb_custom_cmp_variable functions[] = {_multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp,
                                           _multi_kv_test_keycmp};

    sprintf(value, SHELL_DEL" multi_kv_test*");
    r = system(value);
    (void)r;

    memleak_start();

    config = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    config.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    config.chunksize = chunksize;
    config.multi_kv_instances = true;
    config.wal_threshold = 1000;
    config.buffercache_size = 0;
    // for rollback, disable block reusing
    config.block_reusing_threshold = 0;

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents first time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv1, &seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents second time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(db, &seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_get_kvs_seqnum(kv2, &seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // write documents third time
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%15 == 0) s = fdb_set(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, value, strlen(value)+1);
        s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if (i%27 == 0) s = fdb_set(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // rollback kv1 using seq1
    s = fdb_rollback(&kv1, seq1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq2
    s = fdb_rollback(&db, seq2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit4)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // rollback db using seq3
    s = fdb_rollback(&kv2, seq3);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // retrieve check
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    // close & re-open
    s = fdb_kvs_close(kv1);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(kv2);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    if (opt & MULTI_KV_VAR_CMP) {
        s = fdb_open_custom_cmp(&dbfile, "./multi_kv_test", &config,
                                3, kvs_names, functions, NULL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    } else {
        s = fdb_open(&dbfile, "./multi_kv_test", &config);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    fdb_kvs_open(dbfile, &kv2, "kv2", &kvs_config);

    // retrieve check after re-open
    for (i=0;i<n;++i){
        sprintf(key, keystr, i);
        sprintf(value, valuestr, i, "default(commit2)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(db, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv1(commit1)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv1, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
        sprintf(value, valuestr, i, "kv2(commit3)");
        fdb_doc_create(&doc, key, strlen(key)+1, NULL, 0, NULL, 0);
        s = fdb_get(kv2, doc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        TEST_CMP(value, doc->body, doc->bodylen);
        fdb_doc_free(doc);
    }

    fdb_kvs_close(kv1);
    fdb_kvs_close(kv2);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();

    if (opt & MULTI_KV_VAR_CMP) {
        TEST_RESULT("multiple KV instances rollback test "
                    "(custom key order)");
    } else {
        TEST_RESULT("multiple KV instances rollback test");
    }
}